

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.hh
# Opt level: O1

void __thiscall
tinyusdz::MaterialBinding::set_materialBinding
          (MaterialBinding *this,Relationship *rel,token *mat_purpose)

{
  int iVar1;
  mapped_type *pmVar2;
  
  if ((mat_purpose->str_)._M_string_length != 0) {
    iVar1 = ::std::__cxx11::string::compare((char *)mat_purpose);
    if (iVar1 != 0) {
      iVar1 = ::std::__cxx11::string::compare((char *)mat_purpose);
      if (iVar1 != 0) {
        pmVar2 = ::std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Relationship,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Relationship>_>_>
                 ::operator[](&this->_materialBindingMap,&mat_purpose->str_);
        pmVar2->type = rel->type;
        Path::operator=(&pmVar2->targetPath,&rel->targetPath);
        ::std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::operator=
                  (&pmVar2->targetPathVector,&rel->targetPathVector);
        pmVar2->listOpQual = rel->listOpQual;
        AttrMetas::operator=(&pmVar2->_metas,&rel->_metas);
        pmVar2->_varying_authored = rel->_varying_authored;
        return;
      }
    }
    this = (MaterialBinding *)&this->materialBindingFull;
  }
  nonstd::optional_lite::optional<tinyusdz::Relationship>::operator=(&this->materialBinding,rel);
  return;
}

Assistant:

void set_materialBinding(const Relationship &rel, const value::token &mat_purpose) {

    if (mat_purpose.str().empty()) {
      return set_materialBinding(rel);
    } else if (mat_purpose.str() == "full") {
      return set_materialBindingFull(rel);
    } else if (mat_purpose.str() == "preview") {
      return set_materialBindingFull(rel);
    } else {
      _materialBindingMap[mat_purpose.str()] = rel;
    }
  }